

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O1

string * FormatScript_abi_cxx11_(string *__return_storage_ptr__,CScript *script)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  const_iterator __first;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  CScript *pCVar9;
  const_iterator end;
  ulong uVar10;
  _Alloc_hider _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  opcodetype op;
  const_iterator it;
  string str;
  string ret;
  allocator_type local_121;
  uchar *local_120;
  long local_118;
  long local_110;
  allocator_type local_101;
  undefined1 local_100 [32];
  void *pvStack_e0;
  long local_d8;
  opcodetype local_c4;
  const_iterator local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_c0.ptr = (uchar *)script;
  if (0x1c < (script->super_CScriptBase)._size) {
    local_c0.ptr = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  }
  do {
    __first.ptr = local_c0.ptr;
    uVar1 = (script->super_CScriptBase)._size;
    uVar7 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar7 = uVar1;
    }
    pCVar9 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar9 = script;
    }
    end.ptr = (uchar *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar7);
    if (local_c0.ptr == end.ptr) break;
    local_100._24_8_ = (void *)0x0;
    pvStack_e0 = (void *)0x0;
    local_d8 = 0;
    bVar4 = GetScriptOp(&local_c0,end,&local_c4,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_100 + 0x18))
    ;
    if (bVar4) {
      if (local_c4 == OP_0) {
        iVar5 = 2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_58,"0 ");
      }
      else {
        if (local_c4 == OP_1NEGATE || local_c4 - OP_1 < 0x10) {
          local_98._M_dataplus._M_p._0_4_ = local_c4 - OP_RESERVED;
          tinyformat::format<int>(&local_78,"%i ",(int *)&local_98);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            uVar10 = local_78.field_2._M_allocated_capacity + 1;
            _Var11._M_p = local_78._M_dataplus._M_p;
LAB_0034e25a:
            operator_delete(_Var11._M_p,uVar10);
          }
        }
        else {
          if (local_c4 - OP_NOP < 0x59) {
            GetOpName_abi_cxx11_(&local_78,local_c4);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_98,&local_78,0,3);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"OP_","");
            if (local_98._M_string_length == local_b8._M_string_length) {
              if (local_98._M_string_length == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp(local_98._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                             local_98._M_string_length);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            iVar5 = 0;
            if (bVar4) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_b8,&local_78,3,0xffffffffffffffff);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_b8," ");
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar2 == paVar8) {
                local_98.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_98.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_98._M_dataplus._M_p = (pointer)paVar2;
              }
              local_98._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_58,local_98._M_dataplus._M_p,local_98._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              iVar5 = 2;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (bVar4) goto LAB_0034e264;
          }
          if (pvStack_e0 == (void *)local_100._24_8_) {
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,
                       local_c0,(allocator_type *)pbVar6);
            s_02.m_size = local_b8._M_string_length - (long)local_b8._M_dataplus._M_p;
            s_02.m_data = (uchar *)local_b8._M_dataplus._M_p;
            HexStr_abi_cxx11_(&local_98,s_02);
            tinyformat::format<std::__cxx11::string>
                      (&local_78,(tinyformat *)0x4cecde,(char *)&local_98,pbVar6);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            _Var11._M_p = local_b8._M_dataplus._M_p;
            uVar3 = local_b8.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
              _Var11._M_p = local_b8._M_dataplus._M_p;
              uVar3 = local_b8.field_2._M_allocated_capacity;
            }
          }
          else {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_100,__first,
                       (const_iterator)
                       (local_c0.ptr + -(ulong)(uint)((int)pvStack_e0 - (int)local_100._24_8_)),
                       &local_101);
            s_00.m_size = local_100._8_8_ - local_100._0_8_;
            s_00.m_data = (uchar *)local_100._0_8_;
            HexStr_abi_cxx11_(&local_98,s_00);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_120,
                       (const_iterator)
                       (local_c0.ptr + -(ulong)(uint)((int)pvStack_e0 - local_100._24_4_)),local_c0,
                       &local_121);
            s_01.m_size = local_118 - (long)local_120;
            s_01.m_data = local_120;
            HexStr_abi_cxx11_(&local_b8,s_01);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_78,(tinyformat *)"0x%x 0x%x ",(char *)&local_98,&local_b8,in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_120 != (uchar *)0x0) {
              operator_delete(local_120,local_110 - (long)local_120);
            }
            _Var11._M_p = (pointer)local_100._0_8_;
            uVar3 = local_100._16_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
              _Var11._M_p = (pointer)local_100._0_8_;
              uVar3 = local_100._16_8_;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var11._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar10 = uVar3 - (long)_Var11._M_p;
            goto LAB_0034e25a;
          }
        }
        iVar5 = 2;
      }
    }
    else {
      uVar1 = (script->super_CScriptBase)._size;
      uVar7 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar7 = uVar1;
      }
      pCVar9 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        pCVar9 = script;
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,
                 (uchar *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar7),
                 (allocator_type *)pbVar6);
      s.m_size = local_b8._M_string_length - (long)local_b8._M_dataplus._M_p;
      s.m_data = (uchar *)local_b8._M_dataplus._M_p;
      HexStr_abi_cxx11_(&local_98,s);
      tinyformat::format<std::__cxx11::string>
                (&local_78,(tinyformat *)0x4cecde,(char *)&local_98,pbVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_b8._M_dataplus._M_p,
                        local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
      }
      iVar5 = 3;
    }
LAB_0034e264:
    if ((void *)local_100._24_8_ != (void *)0x0) {
      operator_delete((void *)local_100._24_8_,local_d8 - local_100._24_8_);
    }
  } while (iVar5 == 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,&local_58,0,local_58._M_string_length - 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatScript(const CScript& script)
{
    std::string ret;
    CScript::const_iterator it = script.begin();
    opcodetype op;
    while (it != script.end()) {
        CScript::const_iterator it2 = it;
        std::vector<unsigned char> vch;
        if (script.GetOp(it, op, vch)) {
            if (op == OP_0) {
                ret += "0 ";
                continue;
            } else if ((op >= OP_1 && op <= OP_16) || op == OP_1NEGATE) {
                ret += strprintf("%i ", op - OP_1NEGATE - 1);
                continue;
            } else if (op >= OP_NOP && op <= OP_NOP10) {
                std::string str(GetOpName(op));
                if (str.substr(0, 3) == std::string("OP_")) {
                    ret += str.substr(3, std::string::npos) + " ";
                    continue;
                }
            }
            if (vch.size() > 0) {
                ret += strprintf("0x%x 0x%x ", HexStr(std::vector<uint8_t>(it2, it - vch.size())),
                                               HexStr(std::vector<uint8_t>(it - vch.size(), it)));
            } else {
                ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, it)));
            }
            continue;
        }
        ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, script.end())));
        break;
    }
    return ret.substr(0, ret.empty() ? ret.npos : ret.size() - 1);
}